

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

Message * __thiscall testing::Message::operator<<(Message *this,char **pointer)

{
  StrStream *pSVar1;
  ostream *os;
  
  pSVar1 = this->ss_;
  if (*pointer == (char *)0x0) {
    std::operator<<((ostream *)(pSVar1 + 0x10),"(null)");
  }
  else {
    os = (ostream *)(pSVar1 + 0x10);
    if (pSVar1 == (StrStream *)0x0) {
      os = (ostream *)0x0;
    }
    GTestStreamToHelper<char_const*>(os,pointer);
  }
  return this;
}

Assistant:

inline Message& operator <<(T* const& pointer) {  // NOLINT
    if (pointer == NULL) {
      *ss_ << "(null)";
    } else {
      ::GTestStreamToHelper(ss_, pointer);
    }
    return *this;
  }